

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_StringArg_Test::TestBody(ArgTest_StringArg_Test *this)

{
  StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *this_00;
  StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> visitor_1;
  string_view sref;
  StrictMock<mock_visitor<const_char_*>_> visitor;
  char *cstr;
  char *str;
  char str_data [5];
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_stack_fffffffffffffd38;
  StrictMock<mock_visitor<const_char_*>_> *in_stack_fffffffffffffd40;
  StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *vis;
  StrictMock<mock_visitor<const_char_*>_> *in_stack_fffffffffffffd60;
  allocator local_289;
  char *in_stack_fffffffffffffd78;
  Matcher<const_char_*> *in_stack_fffffffffffffd80;
  Matcher<fmt::v5::basic_string_view<char>_> *in_stack_fffffffffffffda0;
  basic_string_view<char> in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  MockSpec<test_result_(const_char_*)> *in_stack_fffffffffffffe50;
  undefined4 local_10;
  undefined1 local_c;
  
  local_c = 0;
  local_10 = 0x74736574;
  vis = (StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&stack0xfffffffffffffff0;
  testing::StrictMock<mock_visitor<const_char_*>_>::StrictMock(in_stack_fffffffffffffd60);
  testing::Matcher<const_char_*>::Matcher(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  this_00 = (StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)
            mock_visitor<const_char_*>::gmock_visit
                      ((mock_visitor<const_char_*> *)in_stack_fffffffffffffd40,
                       (Matcher<const_char_*> *)in_stack_fffffffffffffd38);
  testing::internal::MockSpec<test_result_(const_char_*)>::InternalExpectedAt
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  testing::Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)0x12159f);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char*>
            ((char **)in_stack_fffffffffffffd40);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<char_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  testing::StrictMock<mock_visitor<const_char_*>_>::~StrictMock(in_stack_fffffffffffffd40);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38)
  ;
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_>::StrictMock(this_00);
  testing::Matcher<fmt::v5::basic_string_view<char>_>::Matcher
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
  mock_visitor<fmt::v5::basic_string_view<char>_>::gmock_visit
            ((mock_visitor<fmt::v5::basic_string_view<char>_> *)in_stack_fffffffffffffd40,
             (Matcher<fmt::v5::basic_string_view<char>_> *)in_stack_fffffffffffffd38);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<char>)>::InternalExpectedAt
            ((MockSpec<test_result_(fmt::v5::basic_string_view<char>)> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe30);
  testing::Matcher<fmt::v5::basic_string_view<char>_>::~Matcher
            ((Matcher<fmt::v5::basic_string_view<char>_> *)0x121684);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd78,(char *)vis,&local_289);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vis);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (vis,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_>::~StrictMock(vis);
  return;
}

Assistant:

TEST(ArgTest, StringArg) {
  char str_data[] = "test";
  char *str = str_data;
  const char *cstr = str;
  CHECK_ARG_(char, cstr, str);

  string_view sref(str);
  CHECK_ARG_(char, sref, std::string(str));
}